

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void andres::marray_detail::
     OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::Assign<int,_short>,_int,_int,_std::allocator<unsigned_long>_>
     ::operate(View<int,_false,_std::allocator<unsigned_long>_> *v,short *x,int *param_3)

{
  size_t sVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  
  sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,1);
  if (sVar1 != 0) {
    uVar3 = 0;
    do {
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      if (sVar1 != 0) {
        uVar4 = 0;
        piVar2 = param_3;
        do {
          *piVar2 = (int)*x;
          sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,0);
          piVar2 = piVar2 + sVar1;
          uVar4 = uVar4 + 1;
          sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
        } while (uVar4 < sVar1);
      }
      View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      View<int,_false,_std::allocator<unsigned_long>_>::strides(v,0);
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,1);
      param_3 = param_3 + sVar1;
      uVar3 = uVar3 + 1;
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,1);
    } while (uVar3 < sVar1);
  }
  View<int,_false,_std::allocator<unsigned_long>_>::shape(v,1);
  View<int,_false,_std::allocator<unsigned_long>_>::strides(v,1);
  return;
}

Assistant:

static inline void operate
    (
        View<T1, false, A>& v, 
        const T2& x, 
        Functor f, 
        T1* data
    )
    {
        for(std::size_t j=0; j<v.shape(N-1); ++j) {
            OperateHelperBinaryScalar<N-1, Functor, T1, T2, A>::operate(
                v, x, f, data);
            data += v.strides(N-1);
        }
        data -= v.shape(N-1) * v.strides(N-1);
    }